

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O2

EVaction old_EVassoc_terminal_action
                   (CManager cm,EVstone stone,CMFormatList format_list,EVSimpleHandlerFunc handler,
                   void *client_data)

{
  undefined8 *puVar1;
  FMFieldList list;
  int iVar2;
  EVaction EVar3;
  CMFormatList pCVar4;
  FMStructDescList format_list_00;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  uVar7 = (ulong)(uint)stone;
  uVar5 = 0x20;
  lVar8 = 0;
  for (pCVar4 = format_list;
      (format_list != (CMFormatList)0x0 && (pCVar4->format_name != (char *)0x0));
      pCVar4 = pCVar4 + 1) {
    lVar8 = lVar8 + 1;
    uVar5 = uVar5 + 0x20;
  }
  format_list_00 = (FMStructDescList)INT_CMmalloc(uVar5 & 0x1fffffffe0);
  lVar6 = 8;
  while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
    *(undefined8 *)((long)format_list_00 + lVar6 * 2 + -0x10) =
         *(undefined8 *)((long)format_list + lVar6 + -8);
    list = *(FMFieldList *)((long)&format_list->format_name + lVar6);
    *(FMFieldList *)((long)format_list_00 + lVar6 * 2 + -8) = list;
    iVar2 = struct_size_field_list(list,(int)uVar7);
    *(int *)((long)&format_list_00->format_name + lVar6 * 2) = iVar2;
    *(undefined8 *)((long)&format_list_00->field_list + lVar6 * 2) = 0;
    lVar6 = lVar6 + 0x10;
  }
  puVar1 = (undefined8 *)((long)&format_list_00[-1].format_name + uVar5);
  *puVar1 = 0;
  puVar1[1] = 0;
  EVar3 = EVassoc_terminal_action(cm,stone,format_list_00,handler,client_data);
  return EVar3;
}

Assistant:

extern EVaction
old_EVassoc_terminal_action(CManager cm, EVstone stone, CMFormatList format_list, 
			EVSimpleHandlerFunc handler, void* client_data)
{
    FMStructDescList structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;
    return EVassoc_terminal_action(cm, stone, structs, handler, client_data);
}